

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O3

U32 ZSTD_insertAndFindFirstIndexHash3(ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip)

{
  int iVar1;
  U32 *pUVar2;
  BYTE *pBVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar5 = ms->hashLog3;
  if (0x20 < uVar5) {
    __assert_fail("h <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,799,"U32 ZSTD_hash3(U32, U32, U32)");
  }
  if (uVar5 != 0) {
    pUVar2 = ms->hashTable3;
    pBVar3 = (ms->window).base;
    iVar1 = *(int *)ip;
    uVar6 = (long)ip - (long)pBVar3;
    bVar4 = 0x20 - (char)uVar5;
    uVar7 = (ulong)*nextToUpdate3;
    uVar5 = (uint)uVar6;
    if (*nextToUpdate3 < uVar5) {
      do {
        pUVar2[(uint)(*(int *)(pBVar3 + uVar7) * 0x35a7bd00) >> (bVar4 & 0x1f)] = (U32)uVar7;
        uVar7 = uVar7 + 1;
      } while (uVar7 < (uVar6 & 0xffffffff));
    }
    *nextToUpdate3 = uVar5;
    return pUVar2[(uint)(iVar1 * 0x35a7bd00) >> (bVar4 & 0x1f)];
  }
  __assert_fail("hashLog3 > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                ,0x19f,
                "U32 ZSTD_insertAndFindFirstIndexHash3(const ZSTD_matchState_t *, U32 *, const BYTE *const)"
               );
}

Assistant:

static U32 ZSTD_insertAndFindFirstIndexHash3 (const ZSTD_matchState_t* ms,
                                              U32* nextToUpdate3,
                                              const BYTE* const ip)
{
    U32* const hashTable3 = ms->hashTable3;
    U32 const hashLog3 = ms->hashLog3;
    const BYTE* const base = ms->window.base;
    U32 idx = *nextToUpdate3;
    U32 const target = (U32)(ip - base);
    size_t const hash3 = ZSTD_hash3Ptr(ip, hashLog3);
    assert(hashLog3 > 0);

    while(idx < target) {
        hashTable3[ZSTD_hash3Ptr(base+idx, hashLog3)] = idx;
        idx++;
    }

    *nextToUpdate3 = target;
    return hashTable3[hash3];
}